

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

void __thiscall
tchecker::zg::details::global_m_extrapolation_t::global_m_extrapolation_t
          (global_m_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::global_m_map_t> *clock_bounds)

{
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__global_m_extrapolation_t_0025ea48;
  std::__shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_clock_bounds).
                super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
               ,&clock_bounds->
                 super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
              );
  return;
}

Assistant:

global_m_extrapolation_t::global_m_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::global_m_map_t const> const & clock_bounds)
    : _clock_bounds(clock_bounds)
{
}